

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_list.cpp
# Opt level: O2

RK_S32 __thiscall mpp_list::del_by_key(mpp_list *this,void *data,RK_S32 size,RK_U32 key)

{
  mpp_list_node *pmVar1;
  RK_S32 RVar2;
  
  pmVar1 = this->head;
  RVar2 = 0;
  if ((pmVar1 != (mpp_list_node *)0x0) && (this->count != 0)) {
    RVar2 = -0x16;
    if (pmVar1->next->next != pmVar1) {
      _list_del_node_no_lock(pmVar1->next,data,size);
      this->count = this->count + -1;
    }
  }
  return RVar2;
}

Assistant:

RK_S32 mpp_list::del_by_key(void *data, RK_S32 size, RK_U32 key)
{
    RK_S32 ret = 0;
    if (head && count) {
        struct mpp_list_node *tmp = head->next;
        ret = -EINVAL;
        while (tmp->next != head) {
            if (tmp->key == key) {
                _list_del_node_no_lock(tmp, data, size);
                count--;
                break;
            }
        }
    }
    return ret;
}